

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QMakeParser::BlockScope>::reallocateAndGrow
          (QArrayDataPointer<QMakeParser::BlockScope> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QMakeParser::BlockScope> *old)

{
  BlockScope *pBVar1;
  QArrayData *pQVar2;
  qsizetype qVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  uchar uVar7;
  undefined1 uVar8;
  long lVar9;
  BlockScope *pBVar10;
  BlockScope *pBVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  QArrayDataPointer<QMakeParser::BlockScope> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QMakeParser::BlockScope> *)0x0 && where == GrowsAtEnd) &&
       (pQVar2 = &this->d->super_QArrayData, pQVar2 != (QArrayData *)0x0)) && (0 < n)) &&
     ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    auVar12 = QArrayData::reallocateUnaligned
                        (pQVar2,this->ptr,0x10,
                         n + this->size +
                         ((long)((long)this->ptr -
                                ((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0)) >> 4),
                         Grow);
    this->d = (Data *)auVar12._0_8_;
    this->ptr = (BlockScope *)auVar12._8_8_;
  }
  else {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (BlockScope *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_38,this,n,where);
    if (this->size != 0) {
      lVar9 = this->size + (n >> 0x3f & n);
      if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<QMakeParser::BlockScope> *)0x0))
         || (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        pBVar10 = this->ptr;
        pBVar11 = pBVar10 + lVar9;
        if ((lVar9 != 0) && (0 < lVar9)) {
          do {
            iVar4 = pBVar10->braceLevel;
            bVar5 = pBVar10->special;
            bVar6 = pBVar10->inBranch;
            uVar7 = pBVar10->nest;
            uVar8 = pBVar10->field_0xf;
            pBVar1 = local_38.ptr + local_38.size;
            pBVar1->start = pBVar10->start;
            pBVar1->braceLevel = iVar4;
            pBVar1->special = bVar5;
            pBVar1->inBranch = bVar6;
            pBVar1->nest = uVar7;
            pBVar1->field_0xf = uVar8;
            pBVar10 = pBVar10 + 1;
            local_38.size = local_38.size + 1;
          } while (pBVar10 < pBVar11);
        }
      }
      else {
        pBVar10 = this->ptr;
        pBVar11 = pBVar10 + lVar9;
        if ((lVar9 != 0) && (0 < lVar9)) {
          do {
            iVar4 = pBVar10->braceLevel;
            bVar5 = pBVar10->special;
            bVar6 = pBVar10->inBranch;
            uVar7 = pBVar10->nest;
            uVar8 = pBVar10->field_0xf;
            pBVar1 = local_38.ptr + local_38.size;
            pBVar1->start = pBVar10->start;
            pBVar1->braceLevel = iVar4;
            pBVar1->special = bVar5;
            pBVar1->inBranch = bVar6;
            pBVar1->nest = uVar7;
            pBVar1->field_0xf = uVar8;
            pBVar10 = pBVar10 + 1;
            local_38.size = local_38.size + 1;
          } while (pBVar10 < pBVar11);
        }
      }
    }
    pQVar2 = &this->d->super_QArrayData;
    pBVar10 = this->ptr;
    *(undefined4 *)&this->d = local_38.d._0_4_;
    *(undefined4 *)((long)&this->d + 4) = local_38.d._4_4_;
    *(undefined4 *)&this->ptr = local_38.ptr._0_4_;
    *(undefined4 *)((long)&this->ptr + 4) = local_38.ptr._4_4_;
    qVar3 = this->size;
    this->size = local_38.size;
    local_38.d = (Data *)pQVar2;
    local_38.ptr = pBVar10;
    local_38.size = qVar3;
    if (old != (QArrayDataPointer<QMakeParser::BlockScope> *)0x0) {
      local_38.d = old->d;
      old->d = (Data *)pQVar2;
      local_38.ptr = old->ptr;
      old->ptr = pBVar10;
      local_38.size = old->size;
      old->size = qVar3;
    }
    if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d)->super_QArrayData,0x10,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }